

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.h
# Opt level: O0

void __thiscall pbrt::syntactic::Loc::~Loc(Loc *this)

{
  std::shared_ptr<pbrt::syntactic::File>::~shared_ptr((shared_ptr<pbrt::syntactic::File> *)0x1a9cee)
  ;
  return;
}

Assistant:

struct PBRT_PARSER_INTERFACE Loc {
      //! pretty-print
      std::string toString() const {
        return "@" + (file?file->getFileName():"<invalid>") + ":" + std::to_string(line) + "." + std::to_string(col);
      }

      std::shared_ptr<File> file;
      int line;
      int col;
    }